

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

int LiteScript::Syntax::ReadControlSwitch
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  char cVar1;
  pointer pIVar2;
  pointer pIVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  pointer pIVar9;
  ErrorType *in_RCX;
  ErrorType *errorType_00;
  uint i_3;
  ulong uVar10;
  uint i;
  long lVar11;
  char *pcVar12;
  uint i_2;
  int iVar13;
  int val;
  pointer pIVar14;
  string keyword;
  ulong local_90;
  ulong local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [23];
  allocator local_59;
  string local_58;
  ulong local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar5 = ReadName(text,&local_58);
  iVar13 = 0;
  if ((uVar5 == 0) ||
     (iVar6 = std::__cxx11::string::compare((char *)&local_58), iVar13 = 0, iVar6 != 0))
  goto LAB_0013b248;
  uVar10 = 0;
  while( true ) {
    while( true ) {
      iVar6 = (int)uVar10;
      if ((0x20 < (ulong)(byte)text[uVar10 + 6]) ||
         ((0x100000600U >> ((ulong)(byte)text[uVar10 + 6] & 0x3f) & 1) == 0)) break;
      uVar10 = (ulong)(iVar6 + 1);
    }
    uVar5 = ReadComment(text + uVar10 + 6);
    if (uVar5 == 0) break;
    uVar10 = (ulong)(iVar6 + uVar5);
  }
  if (text[(long)iVar6 + 6] == '(') {
    lVar11 = (long)iVar6 + 7;
    uVar10 = 0;
    while( true ) {
      while( true ) {
        iVar13 = (int)uVar10;
        if ((0x20 < (ulong)(byte)text[uVar10 + lVar11]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar10 + lVar11] & 0x3f) & 1) == 0)) break;
        uVar10 = (ulong)(iVar13 + 1);
      }
      uVar5 = ReadComment(text + uVar10 + lVar11);
      if (uVar5 == 0) break;
      uVar10 = (ulong)(iVar13 + uVar5);
    }
    iVar6 = iVar13 + iVar6 + 7;
    iVar7 = ReadExpression((Syntax *)(text + iVar6),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,in_RCX);
    if (0 < iVar7) {
      iVar7 = iVar7 + iVar6;
      uVar10 = 0;
      while( true ) {
        while( true ) {
          iVar13 = (int)uVar10;
          if ((0x20 < (ulong)(byte)text[uVar10 + (long)iVar7]) ||
             ((0x100000600U >> ((ulong)(byte)text[uVar10 + (long)iVar7] & 0x3f) & 1) == 0)) break;
          uVar10 = (ulong)(iVar13 + 1);
        }
        uVar5 = ReadComment(text + uVar10 + (long)iVar7);
        if (uVar5 == 0) break;
        uVar10 = (ulong)(iVar13 + uVar5);
      }
      iVar13 = iVar13 + iVar7;
      if (text[iVar13] != ')') {
        *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
LAB_0013acb9:
        iVar13 = -iVar13;
        goto LAB_0013b248;
      }
      lVar11 = (long)iVar13 + 1;
      uVar5 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar5 + lVar11]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar5 + lVar11] & 0x3f) & 1) == 0)) break;
          uVar5 = uVar5 + 1;
        }
        uVar8 = ReadComment(text + (ulong)uVar5 + lVar11);
        if (uVar8 == 0) break;
        uVar5 = uVar5 + uVar8;
      }
      iVar13 = uVar5 + iVar13 + 1;
      if (text[iVar13] != '{') {
        *errorType = SCRPT_ERROR_BRACE_OPEN;
        goto LAB_0013ad10;
      }
      lVar11 = (long)iVar13 + 1;
      uVar10 = 0;
      while( true ) {
        while( true ) {
          iVar6 = (int)uVar10;
          if ((0x20 < (ulong)(byte)text[uVar10 + lVar11]) ||
             ((0x100000600U >> ((ulong)(byte)text[uVar10 + lVar11] & 0x3f) & 1) == 0)) break;
          uVar10 = (ulong)(iVar6 + 1);
        }
        uVar5 = ReadComment(text + uVar10 + lVar11);
        if (uVar5 == 0) break;
        uVar10 = (ulong)(iVar6 + uVar5);
      }
      local_38 = (long)(instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(instrl->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start;
      iVar13 = iVar6 + iVar13 + 1;
      lVar11 = (long)iVar13;
      bVar4 = text[lVar11];
      if (bVar4 != 0x7d) {
        local_90 = 0xffffffff;
        errorType_00 = (ErrorType *)0xffffffff;
        local_88 = 0xffffffff;
LAB_0013ae3b:
        pcVar12 = text + lVar11;
        uVar10 = 0;
        do {
          iVar6 = (int)uVar10;
          if ((bVar4 < 0x21) && ((0x100000600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            uVar5 = iVar6 + 1;
          }
          else {
            uVar5 = ReadComment(pcVar12 + uVar10);
            if (uVar5 == 0) goto LAB_0013ae66;
            uVar5 = iVar6 + uVar5;
          }
          uVar10 = (ulong)uVar5;
          bVar4 = pcVar12[uVar10];
        } while( true );
      }
      pIVar9 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pIVar14 = (instrl->
                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0013ad41;
    }
LAB_0013b231:
    if (iVar7 == 0) {
      *errorType = SCRPT_ERROR_EXPRESSION;
      iVar13 = -iVar6;
      goto LAB_0013b248;
    }
  }
  else {
    *errorType = SCRPT_ERROR_PARENTHESIS_OPEN;
    iVar7 = -6;
  }
  iVar13 = iVar7 - iVar6;
LAB_0013b248:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar13;
LAB_0013ae66:
  if (0 < iVar6) {
    iVar13 = iVar13 + iVar6;
LAB_0013b17d:
    lVar11 = (long)iVar13;
    bVar4 = text[lVar11];
    if (bVar4 == 0x7d) goto LAB_0013b190;
    goto LAB_0013ae3b;
  }
  uVar5 = ReadName(pcVar12,&local_58);
  if (uVar5 == 0) {
    *errorType = SCRPT_ERROR_SWITCH_END;
    goto LAB_0013acb9;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 == 0) {
    uVar10 = 0;
    while( true ) {
      while( true ) {
        iVar6 = (int)uVar10;
        if ((0x20 < (ulong)(byte)text[uVar10 + (long)iVar13 + 4]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar10 + (long)iVar13 + 4] & 0x3f) & 1) == 0))
        break;
        uVar10 = (ulong)(iVar6 + 1);
      }
      uVar5 = ReadComment(text + uVar10 + (long)iVar13 + 4);
      if (uVar5 == 0) break;
      uVar10 = (ulong)(iVar6 + uVar5);
    }
    Instruction::Instruction((Instruction *)local_80,INSTR_VALUE_COPY);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)local_80);
    iVar6 = iVar6 + iVar13 + 4;
    Instruction::~Instruction((Instruction *)local_80);
    iVar7 = ReadExpression((Syntax *)(text + iVar6),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,errorType_00);
    if (iVar7 < 1) goto LAB_0013b231;
    iVar7 = iVar7 + iVar6;
    uVar10 = 0;
    while( true ) {
      while( true ) {
        iVar13 = (int)uVar10;
        if ((0x20 < (ulong)(byte)text[uVar10 + (long)iVar7]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar10 + (long)iVar7] & 0x3f) & 1) == 0)) break;
        uVar10 = (ulong)(iVar13 + 1);
      }
      uVar5 = ReadComment(text + uVar10 + (long)iVar7);
      if (uVar5 == 0) break;
      uVar10 = (ulong)(iVar13 + uVar5);
    }
    iVar13 = iVar13 + iVar7;
    if (text[iVar13] != ':') {
      *errorType = SCRPT_ERROR_COLON;
      goto LAB_0013acb9;
    }
    lVar11 = (long)iVar13 + 1;
    uVar5 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar5 + lVar11]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar5 + lVar11] & 0x3f) & 1) == 0)) break;
        uVar5 = uVar5 + 1;
      }
      uVar8 = ReadComment(text + (ulong)uVar5 + lVar11);
      if (uVar8 == 0) break;
      uVar5 = uVar5 + uVar8;
    }
    Instruction::Instruction((Instruction *)local_80,INSTR_OP_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
    pIVar9 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar14 = (instrl->
              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    Instruction::Instruction((Instruction *)local_80,INSTR_JUMP_ELSE);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
    if (-1 < (int)local_88) {
      Instruction::Instruction
                ((Instruction *)local_80,INSTR_JUMP_TO,
                 (int)((ulong)((long)(instrl->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(instrl->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      Instruction::operator=
                ((instrl->
                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start + (local_88 & 0xffffffff),
                 (Instruction *)local_80);
      Instruction::~Instruction((Instruction *)local_80);
    }
    iVar13 = uVar5 + iVar13 + 1;
    lVar11 = (long)iVar13;
    cVar1 = text[lVar11];
    while (cVar1 != '}') {
      pcVar12 = text + lVar11;
      uVar5 = ReadName(pcVar12,&local_58);
      if (uVar5 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)&local_58);
        if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_58), iVar6 == 0))
        break;
      }
      uVar10 = 0;
      while( true ) {
        while( true ) {
          iVar6 = (int)uVar10;
          if ((0x20 < (ulong)(byte)pcVar12[uVar10]) ||
             ((0x100000600U >> ((ulong)(byte)pcVar12[uVar10] & 0x3f) & 1) == 0)) break;
          uVar10 = (ulong)(iVar6 + 1);
        }
        uVar5 = ReadComment(pcVar12 + uVar10);
        if (uVar5 == 0) break;
        uVar10 = (ulong)(iVar6 + uVar5);
      }
      if (iVar6 < 1) {
        iVar6 = ReadInstruction(pcVar12,instrl,errorType);
        if (iVar6 < 1) {
          if (iVar6 != 0) {
            iVar13 = iVar6 - iVar13;
            goto LAB_0013b248;
          }
          *errorType = SCRPT_ERROR_UNKNOW;
          goto LAB_0013acb9;
        }
      }
      iVar13 = iVar13 + iVar6;
      lVar11 = (long)iVar13;
      cVar1 = text[lVar11];
    }
    pIVar2 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar3 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    Instruction::Instruction((Instruction *)local_80,INSTR_JUMP_TO);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)local_80);
    local_90 = (long)pIVar9 - (long)pIVar14 >> 4;
    local_88 = (ulong)((long)pIVar2 - (long)pIVar3) >> 4;
    Instruction::~Instruction((Instruction *)local_80);
    if (-1 < (int)(uint)local_90) {
      Instruction::Instruction
                ((Instruction *)local_80,INSTR_JUMP_ELSE,
                 (int)((ulong)((long)(instrl->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(instrl->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      Instruction::operator=
                ((instrl->
                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start + ((uint)local_90 & 0x7fffffff),
                 (Instruction *)local_80);
      Instruction::~Instruction((Instruction *)local_80);
    }
    goto LAB_0013b17d;
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 != 0) {
    *errorType = SCRPT_ERROR_SWITCH_KEYWORDS;
    goto LAB_0013acb9;
  }
  uVar5 = 0;
  while( true ) {
    while( true ) {
      if ((0x20 < (ulong)(byte)text[(ulong)uVar5 + (long)iVar13 + 7]) ||
         ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar5 + (long)iVar13 + 7] & 0x3f) & 1) == 0))
      break;
      uVar5 = uVar5 + 1;
    }
    uVar8 = ReadComment(text + (ulong)uVar5 + (long)iVar13 + 7);
    if (uVar8 == 0) break;
    uVar5 = uVar5 + uVar8;
  }
  iVar13 = uVar5 + iVar13 + 7;
  if (text[iVar13] != ':') {
    *errorType = SCRPT_ERROR_COLON;
LAB_0013ad10:
    iVar13 = -iVar13;
    goto LAB_0013b248;
  }
  lVar11 = (long)iVar13 + 1;
  uVar10 = 0;
  while( true ) {
    while( true ) {
      iVar6 = (int)uVar10;
      if ((0x20 < (ulong)(byte)text[uVar10 + lVar11]) ||
         ((0x100000600U >> ((ulong)(byte)text[uVar10 + lVar11] & 0x3f) & 1) == 0)) break;
      uVar10 = (ulong)(iVar6 + 1);
    }
    uVar5 = ReadComment(text + uVar10 + lVar11);
    if (uVar5 == 0) break;
    uVar10 = (ulong)(iVar6 + uVar5);
  }
  if (-1 < (int)local_88) {
    Instruction::Instruction
              ((Instruction *)local_80,INSTR_JUMP_TO,
               (int)((ulong)((long)(instrl->
                                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(instrl->
                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4));
    Instruction::operator=
              ((instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start + (local_88 & 0xffffffff),
               (Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
  }
  if (-1 < (int)local_90) {
    Instruction::Instruction
              ((Instruction *)local_80,INSTR_JUMP_ELSE,
               (int)((ulong)((long)(instrl->
                                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(instrl->
                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4));
    Instruction::operator=
              ((instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start + (local_90 & 0xffffffff),
               (Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
  }
  iVar13 = iVar6 + iVar13 + 1;
  lVar11 = (long)iVar13;
  bVar4 = text[lVar11];
  if (bVar4 != 0x7d) {
LAB_0013b3f9:
    pcVar12 = text + lVar11;
    uVar5 = 0;
    do {
      if ((bVar4 < 0x21) && ((0x100000600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
        uVar5 = uVar5 + 1;
      }
      else {
        uVar8 = ReadComment(pcVar12 + uVar5);
        if (uVar8 == 0) goto LAB_0013b42c;
        uVar5 = uVar5 + uVar8;
      }
      bVar4 = pcVar12[uVar5];
    } while( true );
  }
LAB_0013b190:
  pIVar9 = (instrl->
           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar14 = (instrl->
            super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (-1 < (int)local_88) {
    Instruction::Instruction
              ((Instruction *)local_80,INSTR_JUMP_TO,
               (int)((ulong)((long)pIVar14 - (long)pIVar9) >> 4));
    Instruction::operator=
              ((instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start + (local_88 & 0xffffffff),
               (Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
    pIVar9 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (instrl->
              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (-1 < (int)local_90) {
    Instruction::Instruction
              ((Instruction *)local_80,INSTR_JUMP_ELSE,
               (int)((ulong)((long)pIVar14 - (long)pIVar9) >> 4));
    Instruction::operator=
              ((instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start + (local_90 & 0xffffffff),
               (Instruction *)local_80);
    Instruction::~Instruction((Instruction *)local_80);
    pIVar9 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (instrl->
              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_0013ad41:
  val = (int)((ulong)((long)pIVar14 - (long)pIVar9) >> 4);
  iVar6 = (int)(local_38 >> 4);
  iVar7 = val - iVar6;
  if (iVar7 != 0 && iVar6 <= val) {
    lVar11 = (long)iVar6 << 4;
    do {
      pIVar9 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((&pIVar9->code)[lVar11] == ';') && ((&pIVar9->comp_type)[lVar11] == '\x04')) {
        std::__cxx11::string::string
                  ((string *)local_80,*(char **)((long)&pIVar9->comp_value + lVar11),&local_59);
        iVar6 = std::__cxx11::string::compare((char *)local_80);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0]);
        }
        if (iVar6 == 0) {
          Instruction::Instruction((Instruction *)local_80,INSTR_JUMP_TO,val);
          Instruction::operator=
                    ((Instruction *)
                     (&((instrl->
                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_start)->code + lVar11),
                     (Instruction *)local_80);
          Instruction::~Instruction((Instruction *)local_80);
        }
      }
      lVar11 = lVar11 + 0x10;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  Instruction::Instruction((Instruction *)local_80,INSTR_VALUE_POP);
  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
  emplace_back<LiteScript::Instruction>(instrl,(Instruction *)local_80);
  Instruction::~Instruction((Instruction *)local_80);
  iVar13 = iVar13 + 1;
  goto LAB_0013b248;
LAB_0013b42c:
  if ((int)uVar5 < 1) {
    uVar5 = ReadInstruction(pcVar12,instrl,errorType);
    if ((int)uVar5 < 1) {
      if (uVar5 != 0) {
        iVar13 = uVar5 - iVar13;
        goto LAB_0013b248;
      }
      *errorType = SCRPT_ERROR_UNKNOW;
      goto LAB_0013ad10;
    }
  }
  iVar13 = uVar5 + iVar13;
  lVar11 = (long)iVar13;
  bVar4 = text[lVar11];
  if (bVar4 == 0x7d) goto LAB_0013b190;
  goto LAB_0013b3f9;
}

Assistant:

int LiteScript::Syntax::ReadControlSwitch(const char *text, std::vector<Instruction> &instrl,
                                          Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "switch")
        return 0;
    int i = 6, tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '(') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != ')') {
        errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    if (text[i] != '{') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_OPEN;
        return -i;
    }
    ++i;
    i += (int)ReadWhitespace(text + i);
    int jtn = -1, jen = -1, jb = instrl.size();
    while (text[i] != '}') {
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if (ReadName(text + i, keyword) > 0) {
            if (keyword == "case") {
                i += 4;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back(Instruction(InstrCode::INSTR_VALUE_COPY));
                if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
                    if (tmp != 0)
                        return tmp - i;
                    else {
                        errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                        return -i;
                    }
                }
                i += tmp;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                instrl.push_back((Instruction(InstrCode::INSTR_OP_EQU)));
                jen = instrl.size();
                instrl.push_back((Instruction(InstrCode::INSTR_JUMP_ELSE)));
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                while (text[i] != '}' && (ReadName(text + i, keyword) == 0 || (keyword != "case" && keyword != "default"))){
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                jtn = instrl.size();
                instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
            }
            else if (keyword == "default") {
                i += 7;
                i += (int) ReadWhitespace(text + i);
                if (text[i] != ':') {
                    errorType = Script::ErrorType::SCRPT_ERROR_COLON;
                    return -i;
                }
                ++i;
                i += (int) ReadWhitespace(text + i);
                if (jtn >= 0)
                    instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
                if (jen >= 0)
                    instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
                while (text[i] != '}') {
                    if ((tmp = (int)ReadWhitespace(text + i)) > 0)
                        i += tmp;
                    else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
                        i += tmp;
                    else {
                        if (tmp != 0)
                            return tmp - i;
                        else {
                            errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                            return -i;
                        }
                    }
                }
                break;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_KEYWORDS;
                return -i;
            }
        }
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_SWITCH_END;
            return -i;
        }
    }
    if (text[i] != '}') {
        errorType = Script::ErrorType::SCRPT_ERROR_BRACE_CLOSE;
        return -i;
    }
    if (jtn >= 0)
        instrl[jtn] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
    if (jen >= 0)
        instrl[jen] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
    for (int it = jb, sz = instrl.size(); it < sz; it++) {
        if (instrl[it].code == InstrCode::INSTR_JUMP_TO &&
            instrl[it].comp_type == Instruction::CompType::COMP_TYPE_STRING &&
            std::string(instrl[it].comp_value.v_string) == "break")
                instrl[it] = Instruction(InstrCode::INSTR_JUMP_TO, sz);
    }
    instrl.push_back(Instruction(InstrCode::INSTR_VALUE_POP));
    return i + 1;
}